

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

Construct * __thiscall
spvtools::val::Function::AddConstruct(Function *this,Construct *new_construct)

{
  reference pvVar1;
  mapped_type *ppCVar2;
  pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType> pVar3;
  ConstructType local_3c;
  BasicBlock *local_38;
  key_type local_30;
  reference local_20;
  value_type *result;
  Construct *new_construct_local;
  Function *this_local;
  
  result = new_construct;
  new_construct_local = (Construct *)this;
  std::__cxx11::list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>::push_back
            (&this->cfg_constructs_,new_construct);
  pvVar1 = std::__cxx11::list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>::
           back(&this->cfg_constructs_);
  local_20 = pvVar1;
  local_38 = Construct::entry_block(result);
  local_3c = Construct::type(result);
  pVar3 = std::make_pair<spvtools::val::BasicBlock_const*,spvtools::val::ConstructType>
                    (&local_38,&local_3c);
  local_30.first = pVar3.first;
  local_30.second = pVar3.second;
  ppCVar2 = std::
            unordered_map<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*,_spvtools::val::bb_constr_type_pair_hash,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>_>
            ::operator[](&this->entry_block_to_construct_,&local_30);
  *ppCVar2 = pvVar1;
  return local_20;
}

Assistant:

Construct& Function::AddConstruct(const Construct& new_construct) {
  cfg_constructs_.push_back(new_construct);
  auto& result = cfg_constructs_.back();
  entry_block_to_construct_[std::make_pair(new_construct.entry_block(),
                                           new_construct.type())] = &result;
  return result;
}